

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

User * __thiscall
cmCTestP4::GetUserData(User *__return_storage_ptr__,cmCTestP4 *this,string *username)

{
  iterator iVar1;
  iterator iVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> p4_users;
  OutputLogger err;
  UserParser out;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1a8;
  OutputLogger local_188;
  UserParser local_148;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
          ::find(&(this->Users)._M_t,username);
  iVar2 = iVar1;
  if ((_Rb_tree_header *)iVar1._M_node == &(this->Users)._M_t._M_impl.super__Rb_tree_header) {
    local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (char **)0x0;
    local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SetP4Options(this,&local_1a8);
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x747748;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1a8,(char **)&local_148);
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x74774e;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1a8,(char **)&local_148);
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x7d0298;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1a8,(char **)&local_148);
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)(username->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1a8,(char **)&local_148);
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x0;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_1a8,(char **)&local_148);
    UserParser::UserParser(&local_148,this,"users-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              (&local_188,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"users-err> ");
    cmCTestVC::RunChild((cmCTestVC *)this,
                        local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,(OutputParser *)&local_148,
                        (OutputParser *)&local_188,(char *)0x0,Auto);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
            ::find(&(this->Users)._M_t,username);
    if (iVar2._M_node == iVar1._M_node) {
      (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->Name)._M_string_length = 0;
      (__return_storage_ptr__->Name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->Name).field_2 + 8) = 0;
      (__return_storage_ptr__->EMail)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->EMail)._M_string_length = 0;
      (__return_storage_ptr__->EMail).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->EMail).field_2 + 8) = 0;
      (__return_storage_ptr__->AccessTime)._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->AccessTime)._M_string_length = 0;
      (__return_storage_ptr__->AccessTime).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->AccessTime).field_2 + 8) = 0;
      (__return_storage_ptr__->UserName).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->UserName).field_2 + 8) = 0;
      (__return_storage_ptr__->UserName)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->UserName).field_2;
      (__return_storage_ptr__->UserName)._M_string_length = 0;
      (__return_storage_ptr__->Name)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->Name).field_2;
      (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->EMail)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->EMail).field_2;
      (__return_storage_ptr__->EMail).field_2._M_local_buf[0] = '\0';
      (__return_storage_ptr__->AccessTime)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->AccessTime).field_2;
      (__return_storage_ptr__->AccessTime).field_2._M_local_buf[0] = '\0';
      local_188.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_0094d8f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.super_LineParser.Line._M_dataplus._M_p !=
          &local_188.super_LineParser.Line.field_2) {
        operator_delete(local_188.super_LineParser.Line._M_dataplus._M_p,
                        local_188.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__UserParser_0094af18;
      if (local_148.RegexUser.program != (char *)0x0) {
        operator_delete__(local_148.RegexUser.program);
      }
      local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
           (_func_int **)&PTR__LineParser_0094d8f8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148.super_LineParser.Line._M_dataplus._M_p !=
          &local_148.super_LineParser.Line.field_2) {
        operator_delete(local_148.super_LineParser.Line._M_dataplus._M_p,
                        local_148.super_LineParser.Line.field_2._M_allocated_capacity + 1);
      }
      if (local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
          super__Vector_impl_data._M_start == (char **)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    local_188.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0094d8f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.super_LineParser.Line._M_dataplus._M_p !=
        &local_188.super_LineParser.Line.field_2) {
      operator_delete(local_188.super_LineParser.Line._M_dataplus._M_p,
                      local_188.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__UserParser_0094af18;
    if (local_148.RegexUser.program != (char *)0x0) {
      operator_delete__(local_148.RegexUser.program);
    }
    local_148.super_LineParser.super_OutputParser._vptr_OutputParser =
         (_func_int **)&PTR__LineParser_0094d8f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148.super_LineParser.Line._M_dataplus._M_p !=
        &local_148.super_LineParser.Line.field_2) {
      operator_delete(local_148.super_LineParser.Line._M_dataplus._M_p,
                      local_148.super_LineParser.Line.field_2._M_allocated_capacity + 1);
    }
    if (local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (char **)0x0) {
      operator_delete(local_1a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  User::User(__return_storage_ptr__,(User *)(iVar2._M_node + 2));
  return __return_storage_ptr__;
}

Assistant:

cmCTestP4::User cmCTestP4::GetUserData(const std::string& username)
{
  auto it = this->Users.find(username);

  if (it == this->Users.end()) {
    std::vector<char const*> p4_users;
    this->SetP4Options(p4_users);
    p4_users.push_back("users");
    p4_users.push_back("-m");
    p4_users.push_back("1");
    p4_users.push_back(username.c_str());
    p4_users.push_back(nullptr);

    UserParser out(this, "users-out> ");
    OutputLogger err(this->Log, "users-err> ");
    this->RunChild(p4_users.data(), &out, &err);

    // The user should now be added to the map. Search again.
    it = this->Users.find(username);
    if (it == this->Users.end()) {
      return cmCTestP4::User();
    }
  }

  return it->second;
}